

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void xml_help(void)

{
  ctmbstr ptVar1;
  undefined1 local_40 [8];
  CmdOptDesc localPos;
  CmdOptDesc *pos;
  
  ptVar1 = tidyLibraryVersion();
  printf("<?xml version=\"1.0\"?>\n<cmdline version=\"%s\">\n",ptVar1);
  for (localPos.name3 = ""; *(long *)(localPos.name3 + 8) != 0;
      localPos.name3 = localPos.name3 + 0x30) {
    memcpy(local_40,localPos.name3,0x30);
    localize_option_names((CmdOptDesc *)local_40);
    printf(" <option class=\"%s\">\n",cmdopt_catname[*(uint *)localPos.name3].mnemonic);
    print_xml_help_option_element("name",(ctmbstr)localPos._0_8_);
    print_xml_help_option_element("name",localPos.eqconfig);
    print_xml_help_option_element("name",localPos.name2);
    ptVar1 = tidyLocalizedString(*(uint *)(localPos.name3 + 0x10));
    print_xml_help_option_element("description",ptVar1);
    if (*(long *)(localPos.name3 + 0x18) == 0) {
      printf("  <eqconfig />\n");
    }
    else {
      print_xml_help_option_element("eqconfig",(ctmbstr)localPos._16_8_);
    }
    printf(" </option>\n");
    if (localPos._0_8_ != 0) {
      free((void *)localPos._0_8_);
    }
    if (localPos.eqconfig != (ctmbstr)0x0) {
      free(localPos.eqconfig);
    }
    if (localPos.name2 != (ctmbstr)0x0) {
      free(localPos.name2);
    }
  }
  printf("</cmdline>\n");
  return;
}

Assistant:

static void xml_help( void )
{
    const CmdOptDesc* pos;
    CmdOptDesc localPos;

    printf( "<?xml version=\"1.0\"?>\n"
           "<cmdline version=\"%s\">\n", tidyLibraryVersion());

    for( pos=cmdopt_defs; pos->name1; ++pos)
    {
        localPos = *pos;
        localize_option_names(&localPos);
        printf(" <option class=\"%s\">\n", cmdopt_catname[pos->cat].mnemonic );
        print_xml_help_option_element("name", localPos.name1);
        print_xml_help_option_element("name", localPos.name2);
        print_xml_help_option_element("name", localPos.name3);
        print_xml_help_option_element("description", tidyLocalizedString( pos->key ) );
        if (pos->eqconfig)
            print_xml_help_option_element("eqconfig", localPos.eqconfig);
        else
            printf("  <eqconfig />\n");
        printf(" </option>\n");

        if (localPos.name1) free((tmbstr)localPos.name1);
        if (localPos.name2) free((tmbstr)localPos.name2);
        if (localPos.name3) free((tmbstr)localPos.name3);
    }

    printf( "</cmdline>\n" );
}